

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O2

void supdup_free(Backend *be)

{
  Interactor *pIVar1;
  _Bool _Var2;
  
  _Var2 = is_tempseat((Seat *)be[-9].interactor);
  if (_Var2) {
    tempseat_free((Seat *)be[-9].interactor);
  }
  pIVar1 = be[-10].interactor;
  if (pIVar1 != (Interactor *)0x0) {
    (*pIVar1->vt->logpolicy)(pIVar1);
  }
  if (be[-1].vt != (BackendVtable *)0x0) {
    pinger_free((Pinger *)be[-1].vt);
  }
  conf_free((Conf *)be[-4].vt);
  safefree(be[-7].interactor);
  safefree(&be[-10].interactor);
  return;
}

Assistant:

static void supdup_free(Backend *be)
{
    Supdup *supdup = container_of(be, Supdup, backend);

    if (is_tempseat(supdup->seat))
        tempseat_free(supdup->seat);
    if (supdup->s)
        sk_close(supdup->s);
    if (supdup->pinger)
        pinger_free(supdup->pinger);
    conf_free(supdup->conf);
    sfree(supdup->description);
    sfree(supdup);
}